

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableNT.cpp
# Opt level: O3

double __thiscall adios2::VariableNT::MaxDouble(VariableNT *this,size_t step)

{
  VariableBase *pVVar1;
  double dVar2;
  char cVar3;
  byte bVar4;
  short sVar5;
  ushort uVar6;
  uint uVar7;
  ulong uVar8;
  undefined8 uVar9;
  long *plVar10;
  long *plVar11;
  size_type *psVar12;
  float fVar13;
  undefined1 auVar14 [16];
  long *local_110;
  long local_108;
  long local_100;
  long lStack_f8;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  string local_50;
  
  pVVar1 = this->m_Variable;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"in call to VariableNT::MaxDouble","");
  helper::CheckForNullptr<adios2::core::VariableBase>(pVVar1,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  pVVar1 = this->m_Variable;
  switch(*(undefined4 *)(pVVar1 + 0x28)) {
  case 1:
    cVar3 = adios2::core::Variable<signed_char>::Max((ulong)pVVar1);
    uVar7 = (uint)cVar3;
    break;
  case 2:
    sVar5 = adios2::core::Variable<short>::Max((ulong)pVVar1);
    uVar7 = (uint)sVar5;
    break;
  case 3:
    uVar7 = adios2::core::Variable<int>::Max((ulong)pVVar1);
    break;
  case 4:
    uVar8 = adios2::core::Variable<long>::Max((ulong)pVVar1);
    goto LAB_001d8282;
  case 5:
    bVar4 = adios2::core::Variable<unsigned_char>::Max((ulong)pVVar1);
    uVar7 = (uint)bVar4;
    break;
  case 6:
    uVar6 = adios2::core::Variable<unsigned_short>::Max((ulong)pVVar1);
    uVar7 = (uint)uVar6;
    break;
  case 7:
    uVar7 = adios2::core::Variable<unsigned_int>::Max((ulong)pVVar1);
    uVar8 = (ulong)uVar7;
LAB_001d8282:
    return (double)(long)uVar8;
  case 8:
    uVar9 = adios2::core::Variable<unsigned_long>::Max((ulong)pVVar1);
    auVar14._8_4_ = (int)((ulong)uVar9 >> 0x20);
    auVar14._0_8_ = uVar9;
    auVar14._12_4_ = 0x45300000;
    return (auVar14._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)uVar9) - 4503599627370496.0);
  case 9:
    fVar13 = (float)adios2::core::Variable<float>::Max((ulong)pVVar1);
    return (double)fVar13;
  case 10:
    dVar2 = (double)adios2::core::Variable<double>::Max((ulong)pVVar1);
    return dVar2;
  default:
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"bindings::CXX11","");
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"VariableNT","");
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"MaxDouble","");
    adios2::ToString_abi_cxx11_((DataType)local_70);
    plVar10 = (long *)std::__cxx11::string::replace((ulong)local_70,0,(char *)0x0,0x1e64d5);
    plVar11 = plVar10 + 2;
    if ((long *)*plVar10 == plVar11) {
      local_100 = *plVar11;
      lStack_f8 = plVar10[3];
      local_110 = &local_100;
    }
    else {
      local_100 = *plVar11;
      local_110 = (long *)*plVar10;
    }
    local_108 = plVar10[1];
    *plVar10 = (long)plVar11;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_110);
    psVar12 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_f0.field_2._M_allocated_capacity = *psVar12;
      local_f0.field_2._8_8_ = plVar10[3];
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    }
    else {
      local_f0.field_2._M_allocated_capacity = *psVar12;
      local_f0._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_f0._M_string_length = plVar10[1];
    *plVar10 = (long)psVar12;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    helper::Throw<std::runtime_error>(&local_90,&local_b0,&local_d0,&local_f0,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110);
    }
    if (local_70[0] != local_60) {
      operator_delete(local_70[0]);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    return 0.0;
  }
  return (double)(int)uVar7;
}

Assistant:

double VariableNT::MaxDouble(const size_t step) const
{
    helper::CheckForNullptr(m_Variable, "in call to VariableNT::MaxDouble");
    if (m_Variable->m_Type == DataType::Int8)
    {
        return static_cast<double>(
            reinterpret_cast<core::Variable<int8_t> *>(m_Variable)->Max(step));
    }
    else if (m_Variable->m_Type == DataType::UInt8)
    {
        return static_cast<double>(
            reinterpret_cast<core::Variable<uint8_t> *>(m_Variable)->Max(step));
    }
    else if (m_Variable->m_Type == DataType::Int16)
    {
        return static_cast<double>(
            reinterpret_cast<core::Variable<int16_t> *>(m_Variable)->Max(step));
    }
    else if (m_Variable->m_Type == DataType::UInt16)
    {
        return static_cast<double>(
            reinterpret_cast<core::Variable<uint16_t> *>(m_Variable)->Max(step));
    }
    else if (m_Variable->m_Type == DataType::Int32)
    {
        return static_cast<double>(
            reinterpret_cast<core::Variable<int32_t> *>(m_Variable)->Max(step));
    }
    else if (m_Variable->m_Type == DataType::UInt32)
    {
        return static_cast<double>(
            reinterpret_cast<core::Variable<uint32_t> *>(m_Variable)->Max(step));
    }
    else if (m_Variable->m_Type == DataType::Int64)
    {
        return static_cast<double>(
            reinterpret_cast<core::Variable<int64_t> *>(m_Variable)->Max(step));
    }
    else if (m_Variable->m_Type == DataType::UInt64)
    {
        return static_cast<double>(
            reinterpret_cast<core::Variable<uint64_t> *>(m_Variable)->Max(step));
    }
    else if (m_Variable->m_Type == DataType::Float)
    {
        return static_cast<double>(
            reinterpret_cast<core::Variable<float> *>(m_Variable)->Max(step));
    }
    else if (m_Variable->m_Type == DataType::Double)
    {
        return static_cast<double>(
            reinterpret_cast<core::Variable<double> *>(m_Variable)->Max(step));
    }
    helper::Throw<std::runtime_error>("bindings::CXX11", "VariableNT", "MaxDouble",
                                      "invalid data type " + ToString(m_Variable->m_Type) +
                                          ", only basic numeric types support this API");
    return 0;
}